

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,string *value)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  ofstream *__os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  pointer pSVar2;
  Value local_60;
  cmConfigureLog *local_38;
  size_t sStack_30;
  string *local_28;
  string *value_local;
  cmConfigureLog *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (cmConfigureLog *)key._M_len;
  local_28 = value;
  value_local = &this->LogDir;
  __os = BeginLine(this);
  local_38 = this_local;
  sStack_30 = key_local._M_len;
  __str._M_str = (char *)key_local._M_len;
  __str._M_len = (size_t)this_local;
  pbVar1 = std::operator<<(&__os->super_basic_ostream<char,_std::char_traits<char>_>,__str);
  std::operator<<(pbVar1,": ");
  pSVar2 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     (&this->Encoder);
  Json::Value::Value(&local_60,local_28);
  (*pSVar2->_vptr_StreamWriter[2])(pSVar2,&local_60,&this->Stream);
  Json::Value::~Value(&local_60);
  EndLine(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, std::string const& value)
{
  this->BeginLine() << key << ": ";
  this->Encoder->write(value, &this->Stream);
  this->EndLine();
}